

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_LineOpening_XFloors
               (FLineOpening *open,AActor *thing,line_t *linedef,double x,double y,bool restrict)

{
  double dVar1;
  double dVar2;
  sector_t *psVar3;
  xfloor *pxVar4;
  F3DFloor *pFVar5;
  double *pdVar6;
  secplane_t *psVar7;
  undefined1 auVar8 [16];
  double dVar9;
  int iVar10;
  sector_t *psVar11;
  sector_t **ppsVar12;
  uint i;
  ulong uVar13;
  int j;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int local_dc;
  int local_d8;
  sector_t *local_d0;
  double local_c8 [2];
  secplane_t *highestfloorplanes [2];
  xfloor *xf [2];
  double dStack_50;
  
  if (thing != (AActor *)0x0) {
    dVar1 = (thing->__Pos).Z;
    dVar2 = thing->Height;
    psVar11 = linedef->frontsector;
    xf[0] = &psVar11->e->XFloor;
    psVar3 = linedef->backsector;
    xf[1] = &psVar3->e->XFloor;
    if (((psVar11->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) ||
       ((psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
      dVar18 = open->top;
      dVar19 = open->bottom;
      local_c8[0] = (psVar11->floorplane).negiC *
                    ((psVar11->floorplane).normal.Y * y +
                    (psVar11->floorplane).D + (psVar11->floorplane).normal.X * x);
      local_c8[1] = (psVar3->floorplane).negiC *
                    ((psVar3->floorplane).normal.Y * y +
                    (psVar3->floorplane).D + (psVar3->floorplane).normal.X * x);
      highestfloorplanes[0] = (secplane_t *)0x0;
      highestfloorplanes[1] = (secplane_t *)0x0;
      iVar10 = -1;
      local_dc = -1;
      psVar11 = (sector_t *)0x0;
      local_d0 = (sector_t *)0x0;
      auVar8._8_4_ = SUB84(y,0);
      auVar8._0_8_ = y;
      auVar8._12_4_ = (int)((ulong)y >> 0x20);
      dStack_50 = y;
      local_d8 = local_dc;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        pxVar4 = xf[lVar14];
        ppsVar12 = &linedef->backsector;
        if (lVar14 == 0) {
          ppsVar12 = &linedef->frontsector;
        }
        for (uVar13 = 0; uVar13 < (pxVar4->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            uVar13 = uVar13 + 1) {
          pFVar5 = (pxVar4->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar13];
          if ((~pFVar5->flags & 3) == 0) {
            pdVar6 = (double *)(pFVar5->bottom).plane;
            psVar7 = (pFVar5->top).plane;
            dVar16 = pdVar6[4] * (pdVar6[1] * y + pdVar6[3] + *pdVar6 * x);
            dVar17 = psVar7->negiC *
                     (*(double *)((long)&psVar7->normal + 8) * dStack_50 +
                     psVar7->D + (psVar7->normal).X * x);
            dVar15 = (dVar16 + dVar17) * 0.5;
            dVar9 = ABS(dVar1 - dVar15);
            dVar15 = ABS((dVar2 + dVar1) - dVar15);
            if ((dVar16 < dVar18) && (dVar15 < dVar9)) {
              local_d8 = ((pFVar5->bottom).texture)->texnum;
              local_d0 = *ppsVar12;
              dVar18 = dVar16;
            }
            if (((dVar19 < dVar17) && (dVar9 <= dVar15)) &&
               ((!restrict || (dVar17 <= (thing->__Pos).Z)))) {
              local_dc = ((pFVar5->top).texture)->texnum;
              iVar10 = sector_t::GetTerrain(pFVar5->model,(pFVar5->top).isceiling);
              dStack_50 = auVar8._8_8_;
              psVar11 = *ppsVar12;
              highestfloorplanes[lVar14] = (pFVar5->top).plane;
              dVar19 = dVar17;
            }
            if ((local_c8[lVar14] <= dVar17 && dVar17 != local_c8[lVar14]) &&
               (dVar17 <= (thing->__Pos).Z + thing->MaxStepHeight)) {
              local_c8[lVar14] = dVar17;
            }
          }
        }
      }
      if (open->bottom <= dVar19 && dVar19 != open->bottom) {
        open->bottom = dVar19;
        (open->floorpic).texnum = local_dc;
        open->floorterrain = iVar10;
        open->bottomsec = psVar11;
        if (highestfloorplanes[0] != (secplane_t *)0x0) {
          dVar1 = (highestfloorplanes[0]->normal).Z;
          (open->frontfloorplane).normal.Z = dVar1;
          dVar2 = (highestfloorplanes[0]->normal).Y;
          (open->frontfloorplane).normal.X = (highestfloorplanes[0]->normal).X;
          (open->frontfloorplane).normal.Y = dVar2;
          dVar2 = highestfloorplanes[0]->negiC;
          (open->frontfloorplane).D = highestfloorplanes[0]->D;
          (open->frontfloorplane).negiC = dVar2;
          if (dVar1 < 0.0) {
            secplane_t::FlipVert(&open->frontfloorplane);
          }
        }
        if (highestfloorplanes[1] != (secplane_t *)0x0) {
          dVar1 = (highestfloorplanes[1]->normal).Z;
          (open->backfloorplane).normal.Z = dVar1;
          dVar2 = (highestfloorplanes[1]->normal).Y;
          (open->backfloorplane).normal.X = (highestfloorplanes[1]->normal).X;
          (open->backfloorplane).normal.Y = dVar2;
          dVar2 = highestfloorplanes[1]->negiC;
          (open->backfloorplane).D = highestfloorplanes[1]->D;
          (open->backfloorplane).negiC = dVar2;
          if (dVar1 < 0.0) {
            secplane_t::FlipVert(&open->backfloorplane);
          }
        }
      }
      if (dVar18 < open->top) {
        open->top = dVar18;
        (open->ceilingpic).texnum = local_d8;
        open->topsec = local_d0;
      }
      if (local_c8[1] <= local_c8[0]) {
        local_c8[0] = local_c8[1];
      }
      open->lowfloor = local_c8[0];
    }
  }
  return;
}

Assistant:

void P_LineOpening_XFloors (FLineOpening &open, AActor * thing, const line_t *linedef, 
	double x, double y, bool restrict)
{
    if(thing)
    {
		double thingbot, thingtop;
		
		thingbot = thing->Z();
		thingtop = thing->Top();
		

		extsector_t::xfloor *xf[2] = {&linedef->frontsector->e->XFloor, &linedef->backsector->e->XFloor};

		// Check for 3D-floors in the sector (mostly identical to what Legacy does here)
		if(xf[0]->ffloors.Size() || xf[1]->ffloors.Size())
		{
			double    lowestceiling = open.top;
			double    highestfloor = open.bottom;
			double    lowestfloor[2] = {
				linedef->frontsector->floorplane.ZatPoint(x, y), 
				linedef->backsector->floorplane.ZatPoint(x, y) };
			FTextureID highestfloorpic;
			int highestfloorterrain = -1;
			FTextureID lowestceilingpic;
			sector_t *lowestceilingsec = NULL, *highestfloorsec = NULL;
			secplane_t *highestfloorplanes[2] = { NULL, NULL };
			
			highestfloorpic.SetInvalid();
			lowestceilingpic.SetInvalid();
			
			for(int j=0;j<2;j++)
			{
				for(unsigned i=0;i<xf[j]->ffloors.Size();i++)
				{
					F3DFloor *rover = xf[j]->ffloors[i];

					if (!(rover->flags & FF_EXISTS)) continue;
					if (!(rover->flags & FF_SOLID)) continue;
					
					double ff_bottom=rover->bottom.plane->ZatPoint(x, y);
					double ff_top=rover->top.plane->ZatPoint(x, y);
					
					double delta1 = fabs(thingbot - ((ff_bottom + ff_top) / 2));
					double delta2 = fabs(thingtop - ((ff_bottom + ff_top) / 2));
					
					if(ff_bottom < lowestceiling && delta1 > delta2) 
					{
						lowestceiling = ff_bottom;
						lowestceilingpic = *rover->bottom.texture;
						lowestceilingsec = j == 0 ? linedef->frontsector : linedef->backsector;
					}
					
					if(ff_top > highestfloor && delta1 <= delta2 && (!restrict || thing->Z() >= ff_top))
					{
						highestfloor = ff_top;
						highestfloorpic = *rover->top.texture;
						highestfloorterrain = rover->model->GetTerrain(rover->top.isceiling);
						highestfloorsec = j == 0 ? linedef->frontsector : linedef->backsector;
						highestfloorplanes[j] = rover->top.plane;
					}
					if(ff_top > lowestfloor[j] && ff_top <= thing->Z() + thing->MaxStepHeight) lowestfloor[j] = ff_top;
				}
			}
			
			if(highestfloor > open.bottom)
			{
				open.bottom = highestfloor;
				open.floorpic = highestfloorpic;
				open.floorterrain = highestfloorterrain;
				open.bottomsec = highestfloorsec;
				if (highestfloorplanes[0])
				{
					open.frontfloorplane = *highestfloorplanes[0];
					if (open.frontfloorplane.fC() < 0) open.frontfloorplane.FlipVert();
				}
				if (highestfloorplanes[1])
				{
					open.backfloorplane = *highestfloorplanes[1];
					if (open.backfloorplane.fC() < 0) open.backfloorplane.FlipVert();
				}
			}
			
			if(lowestceiling < open.top) 
			{
				open.top = lowestceiling;
				open.ceilingpic = lowestceilingpic;
				open.topsec = lowestceilingsec;
			}
			
			open.lowfloor = MIN(lowestfloor[0], lowestfloor[1]);
		}
    }
}